

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcVertexPoint::IfcVertexPoint(IfcVertexPoint *this)

{
  IfcVertexPoint *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x48,"IfcVertexPoint");
  IfcVertex::IfcVertex(&this->super_IfcVertex,&PTR_construction_vtable_24__00ff9cc8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcVertexPoint,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcVertexPoint,_1UL> *)
             &(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00ff9d40);
  (this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xff9c10;
  *(undefined8 *)&this->field_0x48 = 0xff9cb0;
  *(undefined8 *)
   &(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xff9c38;
  *(undefined8 *)
   &(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xff9c60;
  *(undefined8 *)&(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.field_0x30 =
       0xff9c88;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPoint>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcPoint> *)&(this->super_IfcVertex).field_0x40,
             (LazyObject *)0x0);
  return;
}

Assistant:

IfcVertexPoint() : Object("IfcVertexPoint") {}